

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void exprToRegister(Expr *pExpr,int iReg)

{
  ExprList_item *pEVar1;
  
  while( true ) {
    if (pExpr == (Expr *)0x0) {
      return;
    }
    if ((pExpr->flags & 0x82000) == 0) break;
    if ((pExpr->flags >> 0x13 & 1) == 0) {
      pEVar1 = (ExprList_item *)&pExpr->pLeft;
    }
    else {
      pEVar1 = ((pExpr->x).pList)->a;
    }
    pExpr = pEVar1->pExpr;
  }
  pExpr->op2 = pExpr->op;
  pExpr->op = 0xb0;
  pExpr->iTable = iReg;
  return;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprSkipCollateAndLikely(Expr *pExpr){
  while( pExpr && ExprHasProperty(pExpr, EP_Skip|EP_Unlikely) ){
    if( ExprHasProperty(pExpr, EP_Unlikely) ){
      assert( ExprUseXList(pExpr) );
      assert( pExpr->x.pList->nExpr>0 );
      assert( pExpr->op==TK_FUNCTION );
      pExpr = pExpr->x.pList->a[0].pExpr;
    }else{
      assert( pExpr->op==TK_COLLATE );
      pExpr = pExpr->pLeft;
    }
  }
  return pExpr;
}